

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<short>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<short> *accessor)

{
  short sVar1;
  CURSOR *pCVar2;
  bool bVar3;
  bool bVar4;
  reference pvVar5;
  double dVar6;
  unkbyte10 Var7;
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar2 = accessor->data;
  bVar3 = (pCVar2->scan).next_row_index <= lidx;
  bVar4 = lidx < (pCVar2->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar4 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(short **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
    }
    sVar1 = pCVar2->data[(uint)((int)lidx - (int)(pCVar2->scan).current_row_index)];
    bVar4 = duckdb::TryCast::Operation<short,double>(sVar1,&local_60,false);
    if (!bVar4) {
      Var7 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,double>
                (&local_58,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var7 >> 0x40));
      duckdb::InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var7,(string *)&local_58);
      __cxa_throw((InvalidInputException *)Var7,&InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  else {
    if (bVar4 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(short **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
    }
    sVar1 = pCVar2->data[(uint)((int)lidx - (int)(pCVar2->scan).current_row_index)];
    bVar4 = duckdb::TryCast::Operation<short,double>(sVar1,&local_60,false);
    if (!bVar4) {
      Var7 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,double>
                (&local_58,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var7 >> 0x40));
      duckdb::InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var7,(string *)&local_58);
      __cxa_throw((InvalidInputException *)Var7,&InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    local_38 = local_60;
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= hidx) || (hidx < (pCVar2->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)hidx,(DataChunk *)&pCVar2->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(short **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
    }
    sVar1 = pCVar2->data[(uint)((int)hidx - (int)(pCVar2->scan).current_row_index)];
    bVar4 = duckdb::TryCast::Operation<short,double>(sVar1,&local_60,false);
    if (!bVar4) {
      Var7 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,double>
                (&local_58,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var7 >> 0x40));
      duckdb::InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var7,(string *)&local_58);
      __cxa_throw((InvalidInputException *)Var7,&InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    dVar6 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar6 * local_60 + local_38 * (1.0 - dVar6);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}